

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ATN.hpp
# Opt level: O0

void __thiscall
Centaurus::ATNMachine<wchar_t>::add_transition_from(ATNMachine<wchar_t> *this,int src)

{
  reference this_00;
  size_type sVar1;
  int src_local;
  ATNMachine<wchar_t> *this_local;
  
  this_00 = std::vector<Centaurus::ATNNode<wchar_t>,_std::allocator<Centaurus::ATNNode<wchar_t>_>_>
            ::operator[](&this->m_nodes,(long)src);
  sVar1 = std::vector<Centaurus::ATNNode<wchar_t>,_std::allocator<Centaurus::ATNNode<wchar_t>_>_>::
          size(&this->m_nodes);
  ATNNode<wchar_t>::add_transition(this_00,(int)sVar1 + -1,0);
  return;
}

Assistant:

void add_transition_from(int src)
    {
        m_nodes[src].add_transition(m_nodes.size() - 1);
    }